

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cc
# Opt level: O0

bool woff2::ReadTrueTypeFont(Buffer *file,uint8_t *data,size_t len,Font *font)

{
  uint32_t uVar1;
  bool bVar2;
  mapped_type *pmVar3;
  mapped_type *this;
  reference ppVar4;
  Table *pTVar5;
  Table *head_table;
  pair<const_unsigned_int,_unsigned_int> *i_1;
  iterator __end1;
  iterator __begin1;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *__range1;
  iterator iStack_c8;
  uint32_t last_offset;
  _Self local_c0;
  int local_b8;
  undefined1 local_a8 [8];
  Table table;
  undefined1 local_60 [6];
  uint16_t i;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  intervals;
  Font *font_local;
  size_t len_local;
  uint8_t *data_local;
  Buffer *file_local;
  
  intervals._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)font;
  bVar2 = Buffer::ReadU16(file,&font->num_tables);
  if ((bVar2) && (bVar2 = Buffer::Skip(file,6), bVar2)) {
    std::
    map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
    ::map((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           *)local_60);
    for (table._62_2_ = 0;
        (ushort)table._62_2_ <
        *(ushort *)(intervals._M_t._M_impl.super__Rb_tree_header._M_node_count + 4);
        table._62_2_ = table._62_2_ + 1) {
      Font::Table::Table((Table *)local_a8);
      table.reuse_of._0_1_ = 0;
      table.buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = Buffer::ReadU32(file,(uint32_t *)local_a8);
      if ((((bVar2) && (bVar2 = Buffer::ReadU32(file,(uint32_t *)(local_a8 + 4)), bVar2)) &&
          (bVar2 = Buffer::ReadU32(file,&table.tag), bVar2)) &&
         (bVar2 = Buffer::ReadU32(file,&table.checksum), uVar1 = table.checksum, bVar2)) {
        if ((((table.tag & 3) == 0) && (table.checksum <= len)) &&
           ((ulong)table.tag <= len - table.checksum)) {
          pmVar3 = std::
                   map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                 *)local_60,&table.tag);
          *pmVar3 = uVar1;
          table._8_8_ = data + table.tag;
          local_c0._M_node =
               (_Base_ptr)
               std::
               map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
               ::find((map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                       *)(intervals._M_t._M_impl.super__Rb_tree_header._M_node_count + 8),
                      (key_type *)local_a8);
          iStack_c8 = std::
                      map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                      ::end((map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                             *)(intervals._M_t._M_impl.super__Rb_tree_header._M_node_count + 8));
          bVar2 = std::operator!=(&local_c0,&stack0xffffffffffffff38);
          if (bVar2) {
            file_local._7_1_ = 0;
            local_b8 = 1;
          }
          else {
            this = std::
                   map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                   ::operator[]((map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                                 *)(intervals._M_t._M_impl.super__Rb_tree_header._M_node_count + 8),
                                (key_type *)local_a8);
            Font::Table::operator=(this,(Table *)local_a8);
            local_b8 = 0;
          }
        }
        else {
          file_local._7_1_ = 0;
          local_b8 = 1;
        }
      }
      else {
        file_local._7_1_ = 0;
        local_b8 = 1;
      }
      Font::Table::~Table((Table *)local_a8);
      if (local_b8 != 0) goto LAB_00125a62;
    }
    __range1._4_4_ =
         (uint)*(ushort *)(intervals._M_t._M_impl.super__Rb_tree_header._M_node_count + 4) * 0x10 +
         0xc;
    __end1 = std::
             map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::begin((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                      *)local_60);
    i_1 = (pair<const_unsigned_int,_unsigned_int> *)
          std::
          map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          ::end((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 *)local_60);
    while (bVar2 = std::operator!=(&__end1,(_Self *)&i_1), bVar2) {
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator*
                         (&__end1);
      if ((ppVar4->first < __range1._4_4_) || (ppVar4->first + ppVar4->second < ppVar4->first)) {
        file_local._7_1_ = 0;
        local_b8 = 1;
        goto LAB_00125a62;
      }
      __range1._4_4_ = ppVar4->first + ppVar4->second;
      std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator++(&__end1);
    }
    pTVar5 = Font::FindTable((Font *)intervals._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             0x68656164);
    if ((pTVar5 == (Table *)0x0) || (0x33 < pTVar5->length)) {
      file_local._7_1_ = 1;
      local_b8 = 1;
    }
    else {
      file_local._7_1_ = 0;
      local_b8 = 1;
    }
LAB_00125a62:
    std::
    map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
    ::~map((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
            *)local_60);
  }
  else {
    file_local._7_1_ = 0;
  }
  return (bool)(file_local._7_1_ & 1);
}

Assistant:

bool ReadTrueTypeFont(Buffer* file, const uint8_t* data, size_t len,
                      Font* font) {
  // We don't care about the search_range, entry_selector and range_shift
  // fields, they will always be computed upon writing the font.
  if (!file->ReadU16(&font->num_tables) ||
      !file->Skip(6)) {
    return FONT_COMPRESSION_FAILURE();
  }

  std::map<uint32_t, uint32_t> intervals;
  for (uint16_t i = 0; i < font->num_tables; ++i) {
    Font::Table table;
    table.flag_byte = 0;
    table.reuse_of = NULL;
    if (!file->ReadU32(&table.tag) ||
        !file->ReadU32(&table.checksum) ||
        !file->ReadU32(&table.offset) ||
        !file->ReadU32(&table.length)) {
      return FONT_COMPRESSION_FAILURE();
    }
    if ((table.offset & 3) != 0 ||
        table.length > len ||
        len - table.length < table.offset) {
      return FONT_COMPRESSION_FAILURE();
    }
    intervals[table.offset] = table.length;
    table.data = data + table.offset;
    if (font->tables.find(table.tag) != font->tables.end()) {
      return FONT_COMPRESSION_FAILURE();
    }
    font->tables[table.tag] = table;
  }

  // Check that tables are non-overlapping.
  uint32_t last_offset = 12UL + 16UL * font->num_tables;
  for (const auto& i : intervals) {
    if (i.first < last_offset || i.first + i.second < i.first) {
      return FONT_COMPRESSION_FAILURE();
    }
    last_offset = i.first + i.second;
  }

  // Sanity check key tables
  const Font::Table* head_table = font->FindTable(kHeadTableTag);
  if (head_table != NULL && head_table->length < 52) {
    return FONT_COMPRESSION_FAILURE();
  }

  return true;
}